

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnoncontiguousbytedevice.cpp
# Opt level: O3

void __thiscall
QNonContiguousByteDeviceIoDeviceImpl::QNonContiguousByteDeviceIoDeviceImpl
          (QNonContiguousByteDeviceIoDeviceImpl *this,QIODevice *d)

{
  QObject *pQVar1;
  int iVar2;
  undefined4 extraout_var;
  QSlotObjectBase *pQVar3;
  long in_FS_OFFSET;
  QObject local_60;
  undefined8 local_50;
  QObject local_48;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject((QObject *)this,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_00696fd0;
  *(QIODevice **)(this + 0x10) = d;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0x4000;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x31) = 0;
  *(undefined8 *)(this + 0x39) = 0;
  iVar2 = (*(d->super_QObject)._vptr_QObject[0xf])(d);
  *(ulong *)(this + 0x48) = CONCAT44(extraout_var,iVar2);
  pQVar1 = *(QObject **)(this + 0x10);
  local_60.d_ptr.d = (QObjectData *)QNonContiguousByteDevice::readyRead;
  local_50 = 0;
  local_48.d_ptr.d = (QObjectData *)QIODevice::readyRead;
  local_38 = 0;
  pQVar3 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar3->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar3->m_impl =
       QtPrivate::QCallableObject<void_(QNonContiguousByteDevice::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(pQVar3 + 1) = QNonContiguousByteDevice::readyRead;
  pQVar3[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            (&local_48,pQVar1,&local_48.d_ptr.d,(QObject *)this,&local_60.d_ptr.d,pQVar3,
             AutoConnection,(int *)0x0,&QIODevice::staticMetaObject);
  QMetaObject::Connection::~Connection((Connection *)&local_48);
  pQVar1 = *(QObject **)(this + 0x10);
  local_60.d_ptr.d = (QObjectData *)QNonContiguousByteDevice::readyRead;
  local_50 = 0;
  local_48.d_ptr.d = (QObjectData *)QIODevice::readChannelFinished;
  local_38 = 0;
  pQVar3 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar3->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar3->m_impl =
       QtPrivate::QCallableObject<void_(QNonContiguousByteDevice::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(pQVar3 + 1) = QNonContiguousByteDevice::readyRead;
  pQVar3[1].m_impl = (ImplFn)0x0;
  QObject::connectImpl
            (&local_60,pQVar1,&local_48.d_ptr.d,(QObject *)this,&local_60.d_ptr.d,pQVar3,
             AutoConnection,(int *)0x0,&QIODevice::staticMetaObject);
  QMetaObject::Connection::~Connection((Connection *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNonContiguousByteDeviceIoDeviceImpl::QNonContiguousByteDeviceIoDeviceImpl(QIODevice *d)
    : QNonContiguousByteDevice(),
      device(d),
      currentReadBuffer(nullptr),
      currentReadBufferSize(16 * 1024),
      currentReadBufferAmount(0),
      currentReadBufferPosition(0),
      totalAdvancements(0),
      eof(false),
      initialPosition(d->pos())
{
    connect(device, &QIODevice::readyRead, this,
            &QNonContiguousByteDevice::readyRead);
    connect(device, &QIODevice::readChannelFinished, this,
            &QNonContiguousByteDevice::readyRead);
}